

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O1

bool __thiscall
Diligent::ThreadPoolImpl::ProcessTask(ThreadPoolImpl *this,Uint32 ThreadId,bool WaitForTask)

{
  mutex *pmVar1;
  atomic<int> *paVar2;
  size_t sVar3;
  const_iterator __position;
  pointer pRVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  bool bVar9;
  pointer pRVar10;
  float fVar11;
  float extraout_XMM0_Da;
  unique_lock<std::mutex> lock;
  QueuedTaskInfo TaskInfo;
  float local_8c;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  QueuedTaskInfo local_68;
  Uint32 local_44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  float local_34;
  
  local_68.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.pTask.m_pObject = (IAsyncTask *)0x0;
  local_68.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pmVar1 = &this->m_TasksQueueMtx;
  local_88[8] = false;
  local_88._0_8_ = pmVar1;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
  local_88[8] = true;
  if (((WaitForTask) && (((this->m_Stop)._M_base._M_i & 1U) == 0)) &&
     ((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    do {
      std::condition_variable::wait((unique_lock *)&this->m_NextTaskCond);
      if (((this->m_Stop)._M_base._M_i & 1U) != 0) break;
    } while ((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
  }
  sVar3 = (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  bVar8 = sVar3 == 0 & (this->m_Stop)._M_base._M_i;
  if (sVar3 != 0) {
    __position._M_node = (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    RefCntAutoPtr<Diligent::IAsyncTask>::operator=
              (&local_68.pTask,
               (RefCntAutoPtr<Diligent::IAsyncTask> *)&__position._M_node[1]._M_parent);
    std::
    vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
    ::_M_move_assign(&local_68.Prerequisites,&__position._M_node[1]._M_left);
    LOCK();
    (this->m_NumRunningTasks).super___atomic_base<int>._M_i =
         (this->m_NumRunningTasks).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    std::
    _Rb_tree<float,_std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::_Select1st<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
    ::_M_erase_aux(&(this->m_TasksQueue)._M_t,__position);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
  pRVar4 = local_68.Prerequisites.
           super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_68.pTask.m_pObject != (IAsyncTask *)0x0 && bVar8 == 0) {
    local_44 = ThreadId;
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pmVar1;
    if (local_68.Prerequisites.
        super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_68.Prerequisites.
        super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar9 = true;
      local_8c = 3.4028235e+38;
    }
    else {
      local_8c = 3.4028235e+38;
      bVar9 = true;
      pRVar10 = local_68.Prerequisites.
                super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        RefCntWeakPtr<Diligent::IAsyncTask>::Lock((RefCntWeakPtr<Diligent::IAsyncTask> *)local_88);
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_88._0_8_ !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) &&
           (cVar5 = (**(code **)(*(size_type *)local_88._0_8_ + 0x50))(), cVar5 == '\0')) {
          fVar11 = (float)(**(code **)(*(size_type *)local_88._0_8_ + 0x48))();
          if (local_8c <= fVar11) {
            fVar11 = local_8c;
          }
          bVar9 = false;
          local_8c = fVar11;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_88._0_8_ + 0x10))();
          local_88._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
        }
        pRVar10 = pRVar10 + 1;
      } while (pRVar10 != pRVar4);
    }
    if (bVar9) {
      (*((local_68.pTask.m_pObject)->super_IObject)._vptr_IObject[6])(local_68.pTask.m_pObject,2);
      uVar6 = (*((local_68.pTask.m_pObject)->super_IObject)._vptr_IObject[4])
                        (local_68.pTask.m_pObject,(ulong)local_44);
      (*((local_68.pTask.m_pObject)->super_IObject)._vptr_IObject[6])
                (local_68.pTask.m_pObject,(ulong)uVar6);
      iVar7 = (*((local_68.pTask.m_pObject)->super_IObject)._vptr_IObject[10])();
      cVar5 = (char)iVar7;
      if ((cVar5 == '\0') &&
         (iVar7 = (*((local_68.pTask.m_pObject)->super_IObject)._vptr_IObject[7])(), iVar7 != 1)) {
        FormatString<char[67]>
                  ((string *)local_88,
                   (char (*) [67])
                   "Finished tasks must be in COMPLETE, CANCELLED or NOT_STARTED state");
        DebugAssertionFailed
                  ((Char *)local_88._0_8_,"ProcessTask",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                   ,0x8d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._0_8_ != &local_78) {
          operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
        }
      }
    }
    else {
      cVar5 = '\0';
    }
    local_88._0_8_ = local_40;
    local_88[8] = false;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
    local_88[8] = true;
    LOCK();
    paVar2 = &this->m_NumRunningTasks;
    iVar7 = (paVar2->super___atomic_base<int>)._M_i;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    if (cVar5 == '\0') {
      (*((local_68.pTask.m_pObject)->super_IObject)._vptr_IObject[9])();
      if (local_8c < extraout_XMM0_Da) {
        (*((local_68.pTask.m_pObject)->super_IObject)._vptr_IObject[8])(local_8c);
      }
      (*((local_68.pTask.m_pObject)->super_IObject)._vptr_IObject[9])();
      std::
      _Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
      ::_M_emplace_equal<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>
                ((_Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                  *)&this->m_TasksQueue,&local_34,&local_68);
    }
    else if ((iVar7 == 1) &&
            ((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
      std::condition_variable::notify_one();
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
    if (cVar5 == '\0') {
      std::condition_variable::notify_one();
    }
  }
  std::
  vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ::~vector(&local_68.Prerequisites);
  if (local_68.pTask.m_pObject != (IAsyncTask *)0x0) {
    (*((local_68.pTask.m_pObject)->super_IObject)._vptr_IObject[2])();
  }
  return (bool)(bVar8 ^ 1);
}

Assistant:

ProcessTask(Uint32 ThreadId, bool WaitForTask) override final
    {
        QueuedTaskInfo TaskInfo;
        {
            std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
            if (WaitForTask)
            {
                // The effects of notify_one()/notify_all() and each of the three atomic parts of
                // wait()/wait_for()/wait_until() (unlock+wait, wakeup, and lock) take place in a
                // single total order that can be viewed as modification order of an atomic variable:
                // the order is specific to this individual condition variable. This makes it impossible
                // for notify_one() to, for example, be delayed and unblock a thread that started waiting
                // just after the call to notify_one() was made.
                m_NextTaskCond.wait(lock,
                                    [this] //
                                    {
                                        return m_Stop.load() || !m_TasksQueue.empty();
                                    } //
                );
            }

            // m_Stop must be accessed under the mutex
            if (m_Stop.load() && m_TasksQueue.empty())
                return false;

            if (!m_TasksQueue.empty())
            {
                auto front = m_TasksQueue.begin();
                TaskInfo   = std::move(front->second);
                // NB: we must increment the running task counter while holding the lock and
                //     before removing the task from the queue, otherwise WaitForAllTasks() may
                //     miss the task.
                m_NumRunningTasks.fetch_add(1);
                m_TasksQueue.erase(front);
            }
        }

        if (TaskInfo.pTask)
        {
            // Check prerequisites
            bool  PrerequisitesMet  = true;
            float MinPrereqPriority = +FLT_MAX;
            for (auto& pPrereq : TaskInfo.Prerequisites)
            {
                if (auto pPrereqTask = pPrereq.Lock())
                {
                    if (!pPrereqTask->IsFinished())
                    {
                        PrerequisitesMet  = false;
                        MinPrereqPriority = std::min(MinPrereqPriority, pPrereqTask->GetPriority());
                    }
                }
            }

            bool TaskFinished = false;
            if (PrerequisitesMet)
            {
                TaskInfo.pTask->SetStatus(ASYNC_TASK_STATUS_RUNNING);
                ASYNC_TASK_STATUS ReturnStatus = TaskInfo.pTask->Run(ThreadId);
                // NB: It is essential to set the task status after the Run() method returns.
                //     This way if the GetStatus() method returns any value other than ASYNC_TASK_STATUS_RUNNING,
                //     it is guaranteed that the task is not executed by any thread.
                TaskInfo.pTask->SetStatus(ReturnStatus);
                TaskFinished = TaskInfo.pTask->IsFinished();
                DEV_CHECK_ERR((TaskFinished || TaskInfo.pTask->GetStatus() == ASYNC_TASK_STATUS_NOT_STARTED),
                              "Finished tasks must be in COMPLETE, CANCELLED or NOT_STARTED state");
            }

            {
                std::unique_lock<std::mutex> lock{m_TasksQueueMtx};

                const auto NumRunningTasks = m_NumRunningTasks.fetch_add(-1) - 1;

                if (TaskFinished)
                {
                    if (m_TasksQueue.empty() && NumRunningTasks == 0)
                    {
                        m_TasksFinishedCond.notify_one();
                    }
                }
                else
                {
                    // If prerequisites are not met or the task requested to be re-run,
                    // re-enqueue the task with the minimum prerequisite priority
                    if (TaskInfo.pTask->GetPriority() > MinPrereqPriority)
                        TaskInfo.pTask->SetPriority(MinPrereqPriority);
                    m_TasksQueue.emplace(TaskInfo.pTask->GetPriority(), std::move(TaskInfo));
                }
            }

            if (!TaskFinished)
            {
                m_NextTaskCond.notify_one();
            }
        }

        return true;
    }